

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * compact_thread(void *args)

{
  fdb_file_handle *in_RAX;
  int iVar1;
  bool bVar2;
  fdb_file_handle *dbfile;
  
  dbfile = in_RAX;
  fdb_open(&dbfile,"e2edb_main",(fdb_config *)args);
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    sleep(2);
    fdb_compact(dbfile,(char *)0x0);
  }
  fdb_close(dbfile);
  return (void *)0x0;
}

Assistant:

void *compact_thread(void *args) {
    int i;
    fdb_config *fconfig = (fdb_config *)args;
    fdb_file_handle *dbfile;
    fdb_open(&dbfile, E2EDB_MAIN, fconfig);
    for (i = 0; i < 3; ++i) {
        sleep(2);
#ifdef __DEBUG_E2E
        printf("compact: %d\n", i);
#endif
        fdb_compact(dbfile, NULL);
    }
    fdb_close(dbfile);
    return NULL;
}